

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::SetPainChance(PClassActor *this,FName *type,int chance)

{
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *pTVar1;
  FName local_38;
  int local_34;
  FName local_30 [5];
  int local_1c;
  FName *pFStack_18;
  int chance_local;
  FName *type_local;
  PClassActor *this_local;
  
  local_1c = chance;
  pFStack_18 = type;
  type_local = (FName *)this;
  if (chance < 0) {
    if (this->PainChances != (PainChanceList *)0x0) {
      pTVar1 = this->PainChances;
      FName::FName(&local_38,type);
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Remove(pTVar1,&local_38);
    }
  }
  else {
    if (this->PainChances == (PainChanceList *)0x0) {
      pTVar1 = (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)operator_new(0x18);
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap(pTVar1);
      this->PainChances = pTVar1;
    }
    pTVar1 = this->PainChances;
    FName::FName(local_30,type);
    local_34 = MIN<int>(local_1c,0x100);
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Insert(pTVar1,local_30,&local_34);
  }
  return;
}

Assistant:

void PClassActor::SetPainChance(FName type, int chance)
{
	if (chance >= 0) 
	{
		if (PainChances == NULL)
		{
			PainChances = new PainChanceList;
		}
		PainChances->Insert(type, MIN(chance, 256));
	}
	else if (PainChances != NULL)
	{
		PainChances->Remove(type);
	}
}